

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>,void>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>
          *alloc_ref)

{
  ctrl_t *pcVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::EnumValueDescriptor *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::EnumValueDescriptor *>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (this->old_capacity_ != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        puVar4 = (undefined8 *)((long)(this->old_heap_or_soo_).heap.slot_array.p + 0x10);
        uVar6 = 0;
        puVar2 = *(undefined8 **)((long)&c->heap_or_soo_ + 8);
        do {
          puVar5 = puVar2 + 5;
          if (kSentinel < pcVar1[uVar6]) {
            *puVar5 = puVar2 + 7;
            if (puVar4 == (undefined8 *)puVar4[-2]) {
              uVar3 = puVar4[1];
              puVar2[7] = *puVar4;
              puVar2[8] = uVar3;
            }
            else {
              *puVar5 = (undefined8 *)puVar4[-2];
              puVar2[7] = *puVar4;
            }
            puVar2[6] = puVar4[-1];
            puVar4[-2] = puVar4;
            puVar4[-1] = 0;
            *(undefined1 *)puVar4 = 0;
            puVar2[9] = puVar4[2];
          }
          uVar6 = uVar6 + 1;
          puVar4 = puVar4 + 5;
          puVar2 = puVar5;
        } while (uVar6 < this->old_capacity_);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::EnumValueDescriptor *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::EnumValueDescriptor *>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }